

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

int __thiscall gdsForge::GDSwriteInt(gdsForge *this,int record,int *arrInt,int cnt)

{
  FILE *__s;
  size_t __size;
  long lVar1;
  uint j;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sStack_50;
  undefined1 *local_48;
  gdsForge *local_40;
  int local_38;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  uchar OHout [4];
  
  local_31 = (undefined1)record;
  uVar2 = record & 0xff;
  local_40 = this;
  if (uVar2 == 2 && 0 < cnt) {
    uVar2 = 2;
  }
  else if (uVar2 == 3 && 0 < cnt) {
    uVar2 = 4;
  }
  else {
    if (uVar2 != 0 || cnt != 0) {
      sStack_50 = 0x10d62f;
      poVar5 = std::operator<<((ostream *)&std::cout,"Incorrect parameters for record: 0x");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      sStack_50 = 0x10d64f;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,record);
      sStack_50 = 0x10d657;
      std::endl<char,std::char_traits<char>>(poVar5);
      *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
           = *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                      *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      return 1;
    }
    uVar2 = 0;
  }
  iVar3 = uVar2 * cnt + 4;
  local_34 = (undefined1)((uint)iVar3 >> 8);
  local_33 = (undefined1)iVar3;
  local_32 = (undefined1)((uint)record >> 8);
  sStack_50 = 0x10d58c;
  fwrite(&local_34,1,4,(FILE *)this->gdsFile);
  local_48 = (undefined1 *)&local_48;
  lVar1 = -(ulong)(uVar2 + 0xf & 0xfffffff0);
  local_38 = uVar2 * 8 + -8;
  uVar6 = 0;
  uVar7 = (ulong)(uint)cnt;
  if (cnt < 1) {
    uVar7 = 0;
  }
  for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    iVar3 = local_38;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(char *)((long)&local_48 + lVar1 + uVar4) = (char)(arrInt[uVar6] >> ((byte)iVar3 & 0x1f));
      iVar3 = iVar3 + -8;
    }
    __s = (FILE *)local_40->gdsFile;
    *(undefined8 *)((long)&sStack_50 + lVar1) = 1;
    __size = *(size_t *)((long)&sStack_50 + lVar1);
    *(undefined8 *)((long)&sStack_50 + lVar1) = 0x10d5f4;
    fwrite((void *)((long)&local_48 + lVar1),__size,(ulong)uVar2,__s);
  }
  return 0;
}

Assistant:

int gdsForge::GDSwriteInt(int record, int arrInt[], int cnt)
{
  unsigned int dataSize = record & 0xff;

  if (dataSize == 0x02 && cnt > 0) {
    dataSize = 2; // should/could be omitted
  } else if (dataSize == 0x03 && cnt > 0) {
    dataSize = 4;
  } else if (dataSize == 0x00 && cnt == 0) {
    dataSize = 0; // should/could be omitted
  } else {
    cout << "Incorrect parameters for record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }

  unsigned int sizeByte = cnt * dataSize + 4;
  unsigned char OHout[4];

  OHout[0] = sizeByte >> 8 & 0xff;
  OHout[1] = sizeByte & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[dataSize];

  for (int i = 0; i < cnt; i++) {
    for (unsigned int j = 0; j < dataSize; j++) {
      dataOut[j] = arrInt[i] >> (((dataSize - 1) * 8) - (j * 8)) & 0xff;
    }
    fwrite(dataOut, 1, dataSize, this->gdsFile);
  }

  return 0;
}